

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

bool __thiscall FakeCommandRunner::StartCommand(FakeCommandRunner *this,Edge *edge)

{
  VirtualFileSystem *pVVar1;
  Edge *pEVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  Rule *pRVar6;
  string *psVar7;
  reference ppNVar8;
  reference ppNVar9;
  iterator __first;
  iterator __last;
  allocator<char> local_351;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_2d0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_2c8;
  iterator out_3;
  string contents;
  string depfile;
  string local_278;
  undefined1 local_258 [8];
  string dep_2;
  string local_230;
  allocator<char> local_209;
  string local_208;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1e8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1e0;
  iterator out_2;
  string local_1d0;
  undefined1 local_1b0 [8];
  string dep_1;
  string local_188;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_168;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_160;
  iterator out_1;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  string dep;
  string err;
  string content;
  string local_a0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_80;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_78;
  iterator out;
  string local_60;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_40;
  Edge **local_38;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_30;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  Edge *local_20;
  Edge *edge_local;
  FakeCommandRunner *this_local;
  
  local_20 = edge;
  edge_local = (Edge *)this;
  sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size(&this->active_edges_);
  if (this->max_active_edges_ <= sVar5) {
    __assert_fail("active_edges_.size() < max_active_edges_",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24c,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  local_30._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->active_edges_);
  local_38 = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->active_edges_);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,Edge*>
                       (local_30,(__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                                  )local_38,&local_20);
  local_40._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->active_edges_);
  bVar3 = __gnu_cxx::operator==(&local_28,&local_40);
  if (!bVar3) {
    __assert_fail("find(active_edges_.begin(), active_edges_.end(), edge) == active_edges_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24e,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  Edge::EvaluateCommand_abi_cxx11_(&local_60,local_20,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->commands_ran_,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pRVar6 = Edge::rule(local_20);
  psVar7 = Rule::name_abi_cxx11_(pRVar6);
  bVar3 = std::operator==(psVar7,"cat");
  if (!bVar3) {
    pRVar6 = Edge::rule(local_20);
    psVar7 = Rule::name_abi_cxx11_(pRVar6);
    bVar3 = std::operator==(psVar7,"cat_rsp");
    if (!bVar3) {
      pRVar6 = Edge::rule(local_20);
      psVar7 = Rule::name_abi_cxx11_(pRVar6);
      bVar3 = std::operator==(psVar7,"cat_rsp_out");
      if (!bVar3) {
        pRVar6 = Edge::rule(local_20);
        psVar7 = Rule::name_abi_cxx11_(pRVar6);
        bVar3 = std::operator==(psVar7,"cc");
        if (!bVar3) {
          pRVar6 = Edge::rule(local_20);
          psVar7 = Rule::name_abi_cxx11_(pRVar6);
          bVar3 = std::operator==(psVar7,"cp_multi_msvc");
          if (!bVar3) {
            pRVar6 = Edge::rule(local_20);
            psVar7 = Rule::name_abi_cxx11_(pRVar6);
            bVar3 = std::operator==(psVar7,"cp_multi_gcc");
            if (!bVar3) {
              pRVar6 = Edge::rule(local_20);
              psVar7 = Rule::name_abi_cxx11_(pRVar6);
              bVar3 = std::operator==(psVar7,"touch");
              if (!bVar3) {
                pRVar6 = Edge::rule(local_20);
                psVar7 = Rule::name_abi_cxx11_(pRVar6);
                bVar3 = std::operator==(psVar7,"touch-interrupt");
                if (!bVar3) {
                  pRVar6 = Edge::rule(local_20);
                  psVar7 = Rule::name_abi_cxx11_(pRVar6);
                  bVar3 = std::operator==(psVar7,"touch-fail-tick2");
                  if (!bVar3) {
                    pRVar6 = Edge::rule(local_20);
                    psVar7 = Rule::name_abi_cxx11_(pRVar6);
                    bVar3 = std::operator==(psVar7,"true");
                    if (!bVar3) {
                      pRVar6 = Edge::rule(local_20);
                      psVar7 = Rule::name_abi_cxx11_(pRVar6);
                      bVar3 = std::operator==(psVar7,"fail");
                      if (!bVar3) {
                        pRVar6 = Edge::rule(local_20);
                        psVar7 = Rule::name_abi_cxx11_(pRVar6);
                        bVar3 = std::operator==(psVar7,"interrupt");
                        if (!bVar3) {
                          pRVar6 = Edge::rule(local_20);
                          psVar7 = Rule::name_abi_cxx11_(pRVar6);
                          bVar3 = std::operator==(psVar7,"console");
                          if (!bVar3) {
                            pRVar6 = Edge::rule(local_20);
                            psVar7 = Rule::name_abi_cxx11_(pRVar6);
                            bVar3 = std::operator==(psVar7,"cp");
                            if (bVar3) {
                              bVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                                                (&local_20->inputs_);
                              if (((bVar3 ^ 0xffU) & 1) == 0) {
                                __assert_fail("!edge->inputs_.empty()",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                              ,0x263,
                                              "virtual bool FakeCommandRunner::StartCommand(Edge *)"
                                             );
                              }
                              sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                                                (&local_20->outputs_);
                              if (sVar5 != 1) {
                                __assert_fail("edge->outputs_.size() == 1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                              ,0x264,
                                              "virtual bool FakeCommandRunner::StartCommand(Edge *)"
                                             );
                              }
                              std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8))
                              ;
                              std::__cxx11::string::string((string *)(dep.field_2._M_local_buf + 8))
                              ;
                              pVVar1 = this->fs_;
                              ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                                  (&local_20->inputs_,0);
                              psVar7 = Node::path_abi_cxx11_(*ppNVar8);
                              iVar4 = (*(pVVar1->super_DiskInterface).super_FileReader.
                                        _vptr_FileReader[2])
                                                (pVVar1,psVar7,
                                                 (undefined1 *)((long)&err.field_2 + 8),
                                                 (undefined1 *)((long)&dep.field_2 + 8));
                              if (iVar4 == 0) {
                                pVVar1 = this->fs_;
                                ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                                    (&local_20->outputs_,0);
                                psVar7 = Node::path_abi_cxx11_(*ppNVar8);
                                (*(pVVar1->super_DiskInterface).super_FileReader._vptr_FileReader[5]
                                )(pVVar1,psVar7,(undefined1 *)((long)&err.field_2 + 8));
                              }
                              std::__cxx11::string::~string
                                        ((string *)(dep.field_2._M_local_buf + 8));
                              std::__cxx11::string::~string
                                        ((string *)(err.field_2._M_local_buf + 8));
                            }
                            else {
                              pRVar6 = Edge::rule(local_20);
                              psVar7 = Rule::name_abi_cxx11_(pRVar6);
                              bVar3 = std::operator==(psVar7,"touch-implicit-dep-out");
                              pEVar2 = local_20;
                              if (bVar3) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_128,"test_dependency",&local_129);
                                Edge::GetBinding((string *)local_108,pEVar2,&local_128);
                                std::__cxx11::string::~string((string *)&local_128);
                                std::allocator<char>::~allocator(&local_129);
                                pVVar1 = this->fs_;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_150,"",
                                           (allocator<char> *)((long)&out_1._M_current + 7));
                                VirtualFileSystem::Create(pVVar1,(string *)local_108,&local_150);
                                std::__cxx11::string::~string((string *)&local_150);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)((long)&out_1._M_current + 7));
                                VirtualFileSystem::Tick(this->fs_);
                                local_160._M_current =
                                     (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                                        (&local_20->outputs_);
                                while( true ) {
                                  local_168._M_current =
                                       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                                          (&local_20->outputs_);
                                  bVar3 = __gnu_cxx::operator!=(&local_160,&local_168);
                                  if (!bVar3) break;
                                  pVVar1 = this->fs_;
                                  ppNVar9 = __gnu_cxx::
                                            __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                            ::operator*(&local_160);
                                  psVar7 = Node::path_abi_cxx11_(*ppNVar9);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_188,"",
                                             (allocator<char> *)(dep_1.field_2._M_local_buf + 0xf));
                                  VirtualFileSystem::Create(pVVar1,psVar7,&local_188);
                                  std::__cxx11::string::~string((string *)&local_188);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(dep_1.field_2._M_local_buf + 0xf));
                                  __gnu_cxx::
                                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                  ::operator++(&local_160);
                                }
                                std::__cxx11::string::~string((string *)local_108);
                              }
                              else {
                                pRVar6 = Edge::rule(local_20);
                                psVar7 = Rule::name_abi_cxx11_(pRVar6);
                                bVar3 = std::operator==(psVar7,"touch-out-implicit-dep");
                                pEVar2 = local_20;
                                if (bVar3) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_1d0,"test_dependency",
                                             (allocator<char> *)((long)&out_2._M_current + 7));
                                  Edge::GetBinding((string *)local_1b0,pEVar2,&local_1d0);
                                  std::__cxx11::string::~string((string *)&local_1d0);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&out_2._M_current + 7));
                                  local_1e0._M_current =
                                       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                                          (&local_20->outputs_);
                                  while( true ) {
                                    local_1e8._M_current =
                                         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                                            (&local_20->outputs_);
                                    bVar3 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
                                    if (!bVar3) break;
                                    pVVar1 = this->fs_;
                                    ppNVar9 = __gnu_cxx::
                                              __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                              ::operator*(&local_1e0);
                                    psVar7 = Node::path_abi_cxx11_(*ppNVar9);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_208,"",&local_209);
                                    VirtualFileSystem::Create(pVVar1,psVar7,&local_208);
                                    std::__cxx11::string::~string((string *)&local_208);
                                    std::allocator<char>::~allocator(&local_209);
                                    __gnu_cxx::
                                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                    ::operator++(&local_1e0);
                                  }
                                  VirtualFileSystem::Tick(this->fs_);
                                  pVVar1 = this->fs_;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_230,"",
                                             (allocator<char> *)(dep_2.field_2._M_local_buf + 0xf));
                                  VirtualFileSystem::Create(pVVar1,(string *)local_1b0,&local_230);
                                  std::__cxx11::string::~string((string *)&local_230);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(dep_2.field_2._M_local_buf + 0xf));
                                  std::__cxx11::string::~string((string *)local_1b0);
                                }
                                else {
                                  pRVar6 = Edge::rule(local_20);
                                  psVar7 = Rule::name_abi_cxx11_(pRVar6);
                                  bVar3 = std::operator==(psVar7,"generate-depfile");
                                  pEVar2 = local_20;
                                  if (!bVar3) {
                                    printf("unknown command\n");
                                    return false;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_278,"test_dependency",
                                             (allocator<char> *)(depfile.field_2._M_local_buf + 0xf)
                                            );
                                  Edge::GetBinding((string *)local_258,pEVar2,&local_278);
                                  std::__cxx11::string::~string((string *)&local_278);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(depfile.field_2._M_local_buf + 0xf)
                                            );
                                  Edge::GetUnescapedDepfile_abi_cxx11_
                                            ((string *)((long)&contents.field_2 + 8),local_20);
                                  std::__cxx11::string::string((string *)&out_3);
                                  local_2c8._M_current =
                                       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                                          (&local_20->outputs_);
                                  while( true ) {
                                    local_2d0._M_current =
                                         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                                            (&local_20->outputs_);
                                    bVar3 = __gnu_cxx::operator!=(&local_2c8,&local_2d0);
                                    if (!bVar3) break;
                                    ppNVar9 = __gnu_cxx::
                                              __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                              ::operator*(&local_2c8);
                                    psVar7 = Node::path_abi_cxx11_(*ppNVar9);
                                    std::operator+(&local_330,psVar7,": ");
                                    std::operator+(&local_310,&local_330,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_258);
                                    std::operator+(&local_2f0,&local_310,"\n");
                                    std::__cxx11::string::operator+=
                                              ((string *)&out_3,(string *)&local_2f0);
                                    std::__cxx11::string::~string((string *)&local_2f0);
                                    std::__cxx11::string::~string((string *)&local_310);
                                    std::__cxx11::string::~string((string *)&local_330);
                                    pVVar1 = this->fs_;
                                    ppNVar9 = __gnu_cxx::
                                              __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                              ::operator*(&local_2c8);
                                    psVar7 = Node::path_abi_cxx11_(*ppNVar9);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_350,"",&local_351);
                                    VirtualFileSystem::Create(pVVar1,psVar7,&local_350);
                                    std::__cxx11::string::~string((string *)&local_350);
                                    std::allocator<char>::~allocator(&local_351);
                                    __gnu_cxx::
                                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                    ::operator++(&local_2c8);
                                  }
                                  VirtualFileSystem::Create
                                            (this->fs_,(string *)((long)&contents.field_2 + 8),
                                             (string *)&out_3);
                                  std::__cxx11::string::~string((string *)&out_3);
                                  std::__cxx11::string::~string
                                            ((string *)(contents.field_2._M_local_buf + 8));
                                  std::__cxx11::string::~string((string *)local_258);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_001353da;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_78._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&local_20->outputs_);
  while( true ) {
    local_80._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&local_20->outputs_);
    bVar3 = __gnu_cxx::operator!=(&local_78,&local_80);
    if (!bVar3) break;
    pVVar1 = this->fs_;
    ppNVar9 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_78);
    psVar7 = Node::path_abi_cxx11_(*ppNVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"",(allocator<char> *)(content.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(pVVar1,psVar7,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)(content.field_2._M_local_buf + 0xf));
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_78);
  }
LAB_001353da:
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->active_edges_,&local_20);
  __first = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->active_edges_);
  __last = std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->active_edges_);
  std::
  sort<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,bool(*)(Edge_const*,Edge_const*)>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __first._M_current,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __last._M_current,CompareEdgesByOutput::cmp);
  return true;
}

Assistant:

bool FakeCommandRunner::StartCommand(Edge* edge) {
  assert(active_edges_.size() < max_active_edges_);
  assert(find(active_edges_.begin(), active_edges_.end(), edge)
         == active_edges_.end());
  commands_ran_.push_back(edge->EvaluateCommand());
  if (edge->rule().name() == "cat"  ||
      edge->rule().name() == "cat_rsp" ||
      edge->rule().name() == "cat_rsp_out" ||
      edge->rule().name() == "cc" ||
      edge->rule().name() == "cp_multi_msvc" ||
      edge->rule().name() == "cp_multi_gcc" ||
      edge->rule().name() == "touch" ||
      edge->rule().name() == "touch-interrupt" ||
      edge->rule().name() == "touch-fail-tick2") {
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "true" ||
             edge->rule().name() == "fail" ||
             edge->rule().name() == "interrupt" ||
             edge->rule().name() == "console") {
    // Don't do anything.
  } else if (edge->rule().name() == "cp") {
    assert(!edge->inputs_.empty());
    assert(edge->outputs_.size() == 1);
    string content;
    string err;
    if (fs_->ReadFile(edge->inputs_[0]->path(), &content, &err) ==
        DiskInterface::Okay)
      fs_->WriteFile(edge->outputs_[0]->path(), content);
  } else if (edge->rule().name() == "touch-implicit-dep-out") {
    string dep = edge->GetBinding("test_dependency");
    fs_->Create(dep, "");
    fs_->Tick();
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "touch-out-implicit-dep") {
    string dep = edge->GetBinding("test_dependency");
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
    fs_->Tick();
    fs_->Create(dep, "");
  } else if (edge->rule().name() == "generate-depfile") {
    string dep = edge->GetBinding("test_dependency");
    string depfile = edge->GetUnescapedDepfile();
    string contents;
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      contents += (*out)->path() + ": " + dep + "\n";
      fs_->Create((*out)->path(), "");
    }
    fs_->Create(depfile, contents);
  } else {
    printf("unknown command\n");
    return false;
  }

  active_edges_.push_back(edge);

  // Allow tests to control the order by the name of the first output.
  sort(active_edges_.begin(), active_edges_.end(),
       CompareEdgesByOutput::cmp);

  return true;
}